

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O2

void __thiscall CFGsContainer::processCFGs(CFGsContainer *this)

{
  map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
  *this_00;
  bool indirect;
  Type TVar1;
  Addr AVar2;
  CFG *pCVar3;
  mapped_type *ppCVar4;
  BlockData *this_01;
  CfgNode *this_02;
  Instruction *instr;
  CfgNode *this_03;
  Data *data;
  int iVar5;
  string name;
  Addr addr;
  CFG *local_40;
  string *local_38;
  
  this_00 = &this->m_cfgsMap;
  local_38 = (string *)&(this->m_currentToken).token;
  do {
    if ((this->m_currentToken).type != TKN_BRACKET_OPEN) {
      return;
    }
    matchToken(this,TKN_BRACKET_OPEN);
    while( true ) {
      TVar1 = (this->m_currentToken).type;
      if (1 < (uint)(TVar1 + ~TKN_ARROW)) break;
      if (TVar1 == TKN_CFG) {
        matchToken(this,TKN_CFG);
        addr = (this->m_currentToken).data.addr;
        matchToken(this,TKN_ADDR);
        if ((this->m_currentToken).type == TKN_COLON) {
          matchToken(this,TKN_COLON);
          matchToken(this,TKN_NUMBER);
        }
        pCVar3 = cfg(this,addr);
        if (pCVar3 == (CFG *)0x0) {
          pCVar3 = (CFG *)operator_new(0x80);
          CFG::CFG(pCVar3,addr);
          ppCVar4 = std::
                    map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                    ::operator[](this_00,&addr);
          *ppCVar4 = pCVar3;
        }
        std::__cxx11::string::string((string *)&name,local_38);
        matchToken(this,TKN_TEXT);
        CFG::setFunctionName(pCVar3,&name);
        matchToken(this,TKN_BOOL);
        std::__cxx11::string::~string((string *)&name);
      }
      else {
        matchToken(this,TKN_NODE);
        name._M_dataplus._M_p = *(pointer *)&(this->m_currentToken).data;
        matchToken(this,TKN_ADDR);
        pCVar3 = cfg(this,(Addr)name._M_dataplus._M_p);
        if (pCVar3 == (CFG *)0x0) {
          __assert_fail("cfg != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                        ,0x14b,"void CFGsContainer::processCFGs()");
        }
        name._M_dataplus._M_p = *(pointer *)&(this->m_currentToken).data;
        matchToken(this,TKN_ADDR);
        this_01 = (BlockData *)operator_new(0x90);
        CfgNode::BlockData::BlockData(this_01,(Addr)name._M_dataplus._M_p);
        this_02 = CFG::nodeByAddr(pCVar3,(Addr)name._M_dataplus._M_p);
        local_40 = pCVar3;
        if (this_02 == (CfgNode *)0x0) {
          this_02 = (CfgNode *)operator_new(0x78);
          CfgNode::CfgNode(this_02,CFG_BLOCK);
          CfgNode::setData(this_02,(Data *)this_01);
          CFG::addNode(pCVar3,this_02);
        }
        else {
          if (this_02->m_type != CFG_PHANTOM) {
            __assert_fail("block->type() == CfgNode::CFG_PHANTOM",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                          ,0x153,"void CFGsContainer::processCFGs()");
          }
          CfgNode::setData(this_02,(Data *)this_01);
        }
        matchToken(this,TKN_NUMBER);
        matchToken(this,TKN_BRACKET_OPEN);
        while ((this->m_currentToken).type == TKN_NUMBER) {
          AVar2 = (this->m_currentToken).data.addr;
          matchToken(this,TKN_NUMBER);
          iVar5 = (int)AVar2;
          instr = Instruction::get((Addr)name._M_dataplus._M_p,iVar5);
          CfgNode::BlockData::addInstruction(this_01,instr);
          name._M_dataplus._M_p = name._M_dataplus._M_p + iVar5;
        }
        matchToken(this,TKN_BRACKET_CLOSE);
        matchToken(this,TKN_BRACKET_OPEN);
        while ((this->m_currentToken).type == TKN_ADDR) {
          name._M_dataplus._M_p = *(pointer *)&(this->m_currentToken).data;
          matchToken(this,TKN_ADDR);
          if ((this->m_currentToken).type == TKN_COLON) {
            matchToken(this,TKN_COLON);
            matchToken(this,TKN_NUMBER);
          }
          pCVar3 = cfg(this,(Addr)name._M_dataplus._M_p);
          if (pCVar3 == (CFG *)0x0) {
            pCVar3 = (CFG *)operator_new(0x80);
            CFG::CFG(pCVar3,(Addr)name._M_dataplus._M_p);
            ppCVar4 = std::
                      map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                      ::operator[](this_00,(key_type *)&name);
            *ppCVar4 = pCVar3;
          }
          CfgNode::BlockData::addCall(this_01,pCVar3);
        }
        matchToken(this,TKN_BRACKET_CLOSE);
        matchToken(this,TKN_BRACKET_OPEN);
        while ((this->m_currentToken).type == TKN_NUMBER) {
          iVar5 = *(int *)&(this->m_currentToken).data;
          matchToken(this,TKN_NUMBER);
          matchToken(this,TKN_ARROW);
          name._M_dataplus._M_p = *(pointer *)&(this->m_currentToken).data;
          matchToken(this,TKN_ADDR);
          if ((this->m_currentToken).type == TKN_COLON) {
            matchToken(this,TKN_COLON);
            matchToken(this,TKN_NUMBER);
          }
          pCVar3 = cfg(this,(Addr)name._M_dataplus._M_p);
          if (pCVar3 == (CFG *)0x0) {
            pCVar3 = (CFG *)operator_new(0x80);
            CFG::CFG(pCVar3,(Addr)name._M_dataplus._M_p);
            ppCVar4 = std::
                      map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                      ::operator[](this_00,(key_type *)&name);
            *ppCVar4 = pCVar3;
          }
          CfgNode::BlockData::addSignalHandler(this_01,iVar5,pCVar3);
        }
        matchToken(this,TKN_BRACKET_CLOSE);
        indirect = (this->m_currentToken).data.boolean;
        matchToken(this,TKN_BOOL);
        CfgNode::BlockData::setIndirect(this_01,indirect);
        matchToken(this,TKN_BRACKET_OPEN);
        pCVar3 = local_40;
        while (TVar1 = (this->m_currentToken).type, (uint)(TVar1 + ~TKN_NODE) < 3) {
          if (TVar1 == TKN_EXIT) {
            matchToken(this,TKN_EXIT);
            this_03 = pCVar3->m_exitNode;
            if (this_03 == (CfgNode *)0x0) {
              this_03 = (CfgNode *)operator_new(0x78);
              CfgNode::CfgNode(this_03,CFG_EXIT);
              goto LAB_00106ca9;
            }
          }
          else if (TVar1 == TKN_HALT) {
            matchToken(this,TKN_HALT);
            this_03 = pCVar3->m_haltNode;
            if (this_03 == (CfgNode *)0x0) {
              this_03 = (CfgNode *)operator_new(0x78);
              CfgNode::CfgNode(this_03,CFG_HALT);
LAB_00106ca9:
              CFG::addNode(pCVar3,this_03);
            }
          }
          else {
            name._M_dataplus._M_p = *(pointer *)&(this->m_currentToken).data;
            matchToken(this,TKN_ADDR);
            this_03 = CFG::nodeByAddr(pCVar3,(Addr)name._M_dataplus._M_p);
            if (this_03 == (CfgNode *)0x0) {
              data = (Data *)operator_new(0x10);
              data->m_addr = (Addr)name._M_dataplus._M_p;
              data->_vptr_Data = (_func_int **)&PTR__Data_00118ab0;
              this_03 = (CfgNode *)operator_new(0x78);
              CfgNode::CfgNode(this_03,CFG_PHANTOM);
              CfgNode::setData(this_03,data);
              pCVar3 = local_40;
              goto LAB_00106ca9;
            }
          }
          if ((this->m_currentToken).type == TKN_COLON) {
            matchToken(this,TKN_COLON);
            matchToken(this,TKN_NUMBER);
          }
          CFG::addEdge(pCVar3,this_02,this_03);
        }
        matchToken(this,TKN_BRACKET_CLOSE);
      }
    }
    matchToken(this,TKN_BRACKET_CLOSE);
  } while( true );
}

Assistant:

void CFGsContainer::processCFGs() {
	while (m_currentToken.type == Lexeme::TKN_BRACKET_OPEN) {
		matchToken(Lexeme::TKN_BRACKET_OPEN);

		while (m_currentToken.type == Lexeme::TKN_CFG ||
			   m_currentToken.type == Lexeme::TKN_NODE) {
			switch (m_currentToken.type) {
				case Lexeme::TKN_CFG:
				{
					matchToken(Lexeme::TKN_CFG);

					Addr addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					if (m_currentToken.type == Lexeme::TKN_COLON) {
						matchToken(Lexeme::TKN_COLON);
						matchToken(Lexeme::TKN_NUMBER);
					}

					CFG* cfg = this->cfg(addr);
					if (!cfg) {
						cfg = new CFG(addr);
						m_cfgsMap[addr] = cfg;
					}

					std::string name = m_currentToken.token;
					matchToken(Lexeme::TKN_TEXT);
					cfg->setFunctionName(name);

					bool complete = m_currentToken.data.boolean;
					matchToken(Lexeme::TKN_BOOL);
					(void) complete;

					break;
				}
				case Lexeme::TKN_NODE:
				{
					matchToken(Lexeme::TKN_NODE);

					Addr addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					CFG* cfg = this->cfg(addr);
					assert(cfg != 0);

					addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					CfgNode::BlockData* blockData = new CfgNode::BlockData(addr);
					CfgNode* block = cfg->nodeByAddr(addr);
					if (block) {
						assert(block->type() == CfgNode::CFG_PHANTOM);
						block->setData(blockData);
					} else {
						block = new CfgNode(CfgNode::CFG_BLOCK);
						block->setData(blockData);
						cfg->addNode(block);
					}

					int block_size = m_currentToken.data.number;
					matchToken(Lexeme::TKN_NUMBER);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_NUMBER) {
						int instr_size = m_currentToken.data.number;
						matchToken(Lexeme::TKN_NUMBER);

						blockData->addInstruction(Instruction::get(addr, instr_size));
						addr += instr_size;
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					// assert((addr - blockData->addr()) == block_size);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_ADDR) {
						addr = m_currentToken.data.addr;
						matchToken(Lexeme::TKN_ADDR);

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						CFG* call = this->cfg(addr);
						if (!call) {
							call = new CFG(addr);
							m_cfgsMap[addr] = call;
						}

						blockData->addCall(call);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_NUMBER) {
						int sigid = m_currentToken.data.number;
						matchToken(Lexeme::TKN_NUMBER);

						matchToken(Lexeme::TKN_ARROW);

						addr = m_currentToken.data.addr;
						matchToken(Lexeme::TKN_ADDR);

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						CFG* handler = this->cfg(addr);
						if (!handler) {
							handler = new CFG(addr);
							m_cfgsMap[addr] = handler;
						}

						blockData->addSignalHandler(sigid, handler);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					bool indirection = m_currentToken.data.boolean;
					matchToken(Lexeme::TKN_BOOL);

					blockData->setIndirect(indirection);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_ADDR ||
						   m_currentToken.type == Lexeme::TKN_EXIT ||
						   m_currentToken.type == Lexeme::TKN_HALT) {
						CfgNode* succ;
						switch (m_currentToken.type) {
							case Lexeme::TKN_ADDR:
								addr = m_currentToken.data.addr;
								matchToken(Lexeme::TKN_ADDR);

								if (!(succ = cfg->nodeByAddr(addr))) {
									CfgNode::PhantomData* phantomData =
											new CfgNode::PhantomData(addr);

									succ = new CfgNode(CfgNode::CFG_PHANTOM);
									succ->setData(phantomData);

									cfg->addNode(succ);
								}

								break;
							case Lexeme::TKN_EXIT:
								matchToken(Lexeme::TKN_EXIT);

								succ = cfg->exitNode();
								if (!succ) {
									succ = new CfgNode(CfgNode::CFG_EXIT);
									cfg->addNode(succ);
								}

								break;
							case Lexeme::TKN_HALT:
								matchToken(Lexeme::TKN_HALT);

								succ = cfg->haltNode();
								if (!succ) {
									succ = new CfgNode(CfgNode::CFG_HALT);
									cfg->addNode(succ);
								}

								break;
							default:
								assert(false);
						}

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						cfg->addEdge(block, succ);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					break;
				}
				default:
					assert(false);
			}
		}

		matchToken(Lexeme::TKN_BRACKET_CLOSE);
	}
}